

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O1

void __thiscall
charls_jpegls_encoder::transition_to_tables_and_miscellaneous_state(charls_jpegls_encoder *this)

{
  const_byte_span comment;
  
  if (this->state_ != tables_and_miscellaneous) {
    if (this->state_ == spiff_header) {
      charls::jpeg_stream_writer::write_spiff_end_of_directory_entry(&this->writer_);
    }
    else {
      charls::jpeg_stream_writer::write_start_of_image(&this->writer_);
    }
    if ((this->encoding_options_ & include_version_number) != none) {
      comment.size_ = 0xd;
      comment.data_ = (uint8_t *)"charls 2.4.1";
      charls::jpeg_stream_writer::write_comment_segment(&this->writer_,comment);
    }
    this->state_ = tables_and_miscellaneous;
  }
  return;
}

Assistant:

void transition_to_tables_and_miscellaneous_state()
    {
        if (state_ == state::tables_and_miscellaneous)
            return;

        if (state_ == state::spiff_header)
        {
            writer_.write_spiff_end_of_directory_entry();
        }
        else
        {
            writer_.write_start_of_image();
        }

        if (has_option(encoding_options::include_version_number))
        {
            const char* version_number{"charls " TO_STRING(CHARLS_VERSION_MAJOR) "." TO_STRING(
                CHARLS_VERSION_MINOR) "." TO_STRING(CHARLS_VERSION_PATCH)};
            writer_.write_comment_segment({version_number, strlen(version_number) + 1});
        }

        state_ = state::tables_and_miscellaneous;
    }